

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

IShapeVisualization * __thiscall iDynTree::Visualizer::shapes(Visualizer *this)

{
  return &(this->pimpl->m_invalidShapes).super_IShapeVisualization;
}

Assistant:

IShapeVisualization& Visualizer::shapes()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if (!this->pimpl->m_isInitialized)
    {
        init();
    }
    return this->pimpl->m_shapes;
#else
    return this->pimpl->m_invalidShapes;
#endif
}